

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obudec.c
# Opt level: O0

int obudec_read_obu_payload
              (AvxInputContext *input_ctx,size_t payload_length,uint8_t *obu_data,size_t *bytes_read
              ,_Bool buffered)

{
  AvxInputContext *pAVar1;
  long *in_RCX;
  size_t in_RDX;
  AvxInputContext *in_RSI;
  long in_RDI;
  byte in_R8B;
  int local_4;
  
  if ((((in_RDI == 0) || (in_RSI == (AvxInputContext *)0x0)) || (in_RDX == 0)) ||
     (in_RCX == (long *)0x0)) {
    local_4 = -1;
  }
  else {
    pAVar1 = (AvxInputContext *)buffer_input(in_RSI,in_RDX,(uchar *)in_RCX,(_Bool)(in_R8B & 1));
    if (pAVar1 == in_RSI) {
      *in_RCX = (long)((in_RSI->detect).buf + *in_RCX + -0x18);
      local_4 = 0;
    }
    else {
      fprintf(_stderr,"obudec: Failure reading OBU payload.\n");
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int obudec_read_obu_payload(struct AvxInputContext *input_ctx,
                                   size_t payload_length, uint8_t *obu_data,
                                   size_t *bytes_read, bool buffered) {
  if (!input_ctx || payload_length == 0 || !obu_data || !bytes_read) return -1;

  if (buffer_input(input_ctx, payload_length, obu_data, buffered) !=
      payload_length) {
    fprintf(stderr, "obudec: Failure reading OBU payload.\n");
    return -1;
  }

  *bytes_read += payload_length;
  return 0;
}